

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O0

char * AArch64_reg_name(csh handle,uint reg)

{
  uint reg_local;
  csh handle_local;
  char *local_8;
  
  if (reg < 0x104) {
    local_8 = reg_name_maps[reg].name;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *AArch64_reg_name(csh handle, unsigned int reg)
{
#ifndef CAPSTONE_DIET
	if (reg >= ARR_SIZE(reg_name_maps))
		return NULL;

	return reg_name_maps[reg].name;
#else
	return NULL;
#endif
}